

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument.hpp
# Opt level: O3

bool * __thiscall
boost::runtime::arguments_store::get<bool>(arguments_store *this,cstring *parameter_name)

{
  _Base_ptr p_Var1;
  iterator iVar2;
  argument_ptr arg;
  shared_count local_c8;
  undefined **local_c0;
  iterator local_b8;
  iterator local_b0;
  _Alloc_hider local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  access_to_missing_argument local_88;
  access_to_missing_argument local_50;
  
  iVar2 = std::
          _Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
          ::find((_Rb_tree<boost::unit_test::basic_cstring<const_char>,_std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>,_std::_Select1st<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>,_std::less<boost::unit_test::basic_cstring<const_char>_>,_std::allocator<std::pair<const_boost::unit_test::basic_cstring<const_char>,_boost::shared_ptr<boost::runtime::argument>_>_>_>
                  *)this,parameter_name);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->m_arguments)._M_t._M_impl.super__Rb_tree_header) {
    local_a8._M_p = (pointer)&local_98;
    local_b8 = "";
    local_b0 = "";
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_c0 = &PTR__param_error_001c9b48;
    specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>::
    operator<<(&local_88,
               (specific_param_error<boost::runtime::access_to_missing_argument,_boost::runtime::init_error>
                *)&local_c0,"There is no argument provided for parameter ");
    specific_param_error<boost::runtime::access_to_missing_argument,boost::runtime::init_error>::
    operator<<(&local_50,
               (specific_param_error<boost::runtime::access_to_missing_argument,boost::runtime::init_error>
                *)&local_88,parameter_name);
    unit_test::ut_detail::throw_exception<boost::runtime::access_to_missing_argument>(&local_50);
  }
  p_Var1 = iVar2._M_node[1]._M_left;
  local_c8.pi_ = (sp_counted_base *)iVar2._M_node[1]._M_right;
  if ((_Base_ptr)local_c8.pi_ != (_Base_ptr)0x0) {
    LOCK();
    *(int *)&((_Base_ptr)local_c8.pi_)->_M_parent =
         *(int *)&((_Base_ptr)local_c8.pi_)->_M_parent + 1;
    UNLOCK();
  }
  if (p_Var1 != (_Base_ptr)0x0) {
    if (p_Var1->_M_parent == (_Base_ptr)&rtti::rtti_detail::rttid_holder<bool>::inst()::s_inst) {
      detail::shared_count::~shared_count(&local_c8);
      return (bool *)&p_Var1->_M_left;
    }
    local_a8._M_p = (pointer)&local_98;
    local_b8 = "";
    local_b0 = "";
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_c0 = &PTR__param_error_001caa28;
    specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>::operator<<
              ((arg_type_mismatch *)&local_88,
               (specific_param_error<boost::runtime::arg_type_mismatch,_boost::runtime::init_error>
                *)&local_c0,"Access with invalid type for argument corresponding to parameter ");
    specific_param_error<boost::runtime::arg_type_mismatch,boost::runtime::init_error>::operator<<
              ((arg_type_mismatch *)&local_50,
               (specific_param_error<boost::runtime::arg_type_mismatch,boost::runtime::init_error> *
               )&local_88,parameter_name);
    unit_test::ut_detail::throw_exception<boost::runtime::arg_type_mismatch>
              ((arg_type_mismatch *)&local_50);
  }
  __assert_fail("px != 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Sleeplessy[P]ccel/third_party/boost/boost/smart_ptr/shared_ptr.hpp"
                ,0x2de,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<boost::runtime::argument>::operator->() const [T = boost::runtime::argument]"
               );
}

Assistant:

T&          get( cstring parameter_name ) {
        storage_type::const_iterator found = m_arguments.find( parameter_name );
        BOOST_TEST_I_ASSRT( found != m_arguments.end(),
                            access_to_missing_argument() 
                                << "There is no argument provided for parameter "
                                << parameter_name );

        argument_ptr arg = found->second;

        BOOST_TEST_I_ASSRT( arg->p_value_type == rtti::type_id<T>(),
                            arg_type_mismatch()
                                << "Access with invalid type for argument corresponding to parameter "
                                << parameter_name );

        return static_cast<typed_argument<T>&>( *arg ).p_value.value;
    }